

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O0

int32 read_mixw(s2_semi_mgau_t *s,char *file_name,double SmoothMin)

{
  int32 iVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  float64 fVar5;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar6;
  int local_7c;
  uint local_78;
  int32 qscr;
  int32 n_err;
  int32 n_comp;
  int32 n_feat;
  int32 n_sen;
  int32 n;
  int32 c;
  int32 f;
  int32 i;
  float32 *pdf;
  int local_48;
  uint32 chksum;
  int32 chksum_present;
  int32 byteswap;
  FILE *fp;
  char **ppcStack_30;
  char eofchk;
  char **argval;
  char **argname;
  double SmoothMin_local;
  char *file_name_local;
  s2_semi_mgau_t *s_local;
  
  argname = (char **)SmoothMin;
  SmoothMin_local = (double)file_name;
  file_name_local = (char *)s;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
          ,0x44c,"Reading mixture weights file \'%s\'\n",file_name);
  _chksum_present = fopen((char *)SmoothMin_local,"rb");
  if (_chksum_present == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                   ,0x44f,"Failed to open mixture weights file \'%s\' for reading",SmoothMin_local);
    exit(1);
  }
  iVar1 = bio_readhdr((FILE *)_chksum_present,&argval,&stack0xffffffffffffffd0,(int32 *)&chksum);
  if (iVar1 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,0x453,"Failed to read header from file \'%s\'\n",SmoothMin_local);
    exit(1);
  }
  local_48 = 0;
  for (c = 0; argval[c] != (char *)0x0; c = c + 1) {
    iVar2 = strcmp(argval[c],"version");
    if (iVar2 == 0) {
      iVar2 = strcmp(ppcStack_30[c],"1.0");
      if (iVar2 != 0) {
        in_stack_ffffffffffffff68 = 0;
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x45b,"Version mismatch(%s): %s, expecting %s\n",SmoothMin_local,ppcStack_30[c],
                "1.0");
      }
    }
    else {
      iVar2 = strcmp(argval[c],"chksum0");
      if (iVar2 == 0) {
        local_48 = 1;
      }
    }
  }
  bio_hdrarg_free(argval,ppcStack_30);
  ppcStack_30 = (char **)0x0;
  argval = (char **)0x0;
  pdf._4_4_ = 0;
  iVar1 = bio_fread(&n_comp,4,1,(FILE *)_chksum_present,chksum,(uint32 *)((long)&pdf + 4));
  if ((((iVar1 != 1) ||
       (iVar1 = bio_fread(&n_err,4,1,(FILE *)_chksum_present,chksum,(uint32 *)((long)&pdf + 4)),
       iVar1 != 1)) ||
      (iVar1 = bio_fread(&qscr,4,1,(FILE *)_chksum_present,chksum,(uint32 *)((long)&pdf + 4)),
      iVar1 != 1)) ||
     (iVar1 = bio_fread(&n_feat,4,1,(FILE *)_chksum_present,chksum,(uint32 *)((long)&pdf + 4)),
     iVar1 != 1)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,0x46d,"bio_fread(%s) (arraysize) failed\n",SmoothMin_local);
    exit(1);
  }
  if (n_err != *(int *)(*(long *)(file_name_local + 0x18) + 0x24)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,0x470,"#Features streams(%d) != %d\n",(ulong)(uint)n_err,
            (ulong)*(uint *)(*(long *)(file_name_local + 0x18) + 0x24));
    exit(1);
  }
  if (n_feat == n_comp * n_err * qscr) {
    *(int32 *)(file_name_local + 0x38) = n_comp;
    pvVar3 = __ckd_calloc_3d__((long)n_err,(long)*(int *)(*(long *)(file_name_local + 0x18) + 0x28),
                               (long)n_comp,1,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                               ,0x47d);
    *(void **)(file_name_local + 0x20) = pvVar3;
    _f = (float32 *)
         __ckd_calloc__((long)qscr,4,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                        ,0x480);
    local_78 = 0;
    for (c = 0; uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20), c < n_comp;
        c = c + 1) {
      for (n = 0; n < n_err; n = n + 1) {
        iVar1 = bio_fread(_f,4,qscr,(FILE *)_chksum_present,chksum,(uint32 *)((long)&pdf + 4));
        if (iVar1 != qscr) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,0x488,"bio_fread(%s) (arraydata) failed\n",SmoothMin_local);
          exit(1);
        }
        fVar5 = vector_sum_norm(_f,qscr);
        if ((double)fVar5 <= 0.0) {
          local_78 = local_78 + 1;
        }
        vector_floor(_f,qscr,(float64)argname);
        vector_sum_norm(_f,qscr);
        for (n_sen = 0; n_sen < qscr; n_sen = n_sen + 1) {
          iVar2 = logmath_log(*(logmath_t **)(file_name_local + 0x70),
                              (float64)(double)(float)_f[n_sen]);
          local_7c = -iVar2;
          if ((0x9f < local_7c) || (0 < iVar2)) {
            local_7c = 0x9f;
          }
          *(char *)(*(long *)(*(long *)(*(long *)(file_name_local + 0x20) + (long)n * 8) +
                             (long)n_sen * 8) + (long)c) = (char)local_7c;
        }
      }
    }
    if (0 < (int)local_78) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
              ,0x49d,"Weight normalization failed for %d mixture weights components\n",
              (ulong)local_78);
    }
    ckd_free(_f);
    if (local_48 != 0) {
      bio_verify_chksum((FILE *)_chksum_present,chksum,pdf._4_4_);
    }
    sVar4 = fread((void *)((long)&fp + 7),1,1,_chksum_present);
    if (sVar4 != 1) {
      fclose(_chksum_present);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
              ,0x4a9,"Read %d x %d x %d mixture weights\n",(ulong)(uint)n_comp,(ulong)(uint)n_err,
              CONCAT44(uVar6,qscr));
      return n_comp;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,0x4a5,"More data than expected in %s\n",SmoothMin_local);
    exit(1);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
          ,0x474,"%s: #float32s(%d) doesn\'t match header dimensions: %d x %d x %d\n",
          SmoothMin_local,(ulong)(uint)c,
          CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),n_comp),n_err,qscr);
  exit(1);
}

Assistant:

static int32
read_mixw(ptm_mgau_t * s, char const *file_name, double SmoothMin)
{
    char **argname, **argval;
    char eofchk;
    FILE *fp;
    int32 byteswap, chksum_present;
    uint32 chksum;
    float32 *pdf;
    int32 i, f, c, n;
    int32 n_sen;
    int32 n_feat;
    int32 n_comp;
    int32 n_err;

    E_INFO("Reading mixture weights file '%s'\n", file_name);

    if ((fp = fopen(file_name, "rb")) == NULL)
        E_FATAL_SYSTEM("Failed to open mixture file '%s' for reading", file_name);

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0)
        E_FATAL("Failed to read header from '%s'\n", file_name);

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], MGAU_MIXW_VERSION) != 0)
                E_WARN("Version mismatch(%s): %s, expecting %s\n",
                       file_name, argval[i], MGAU_MIXW_VERSION);
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            chksum_present = 1; /* Ignore the associated value */
        }
    }
    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    /* Read #senones, #features, #codewords, arraysize */
    if ((bio_fread(&n_sen, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        || (bio_fread(&n_feat, sizeof(int32), 1, fp, byteswap, &chksum) !=
            1)
        || (bio_fread(&n_comp, sizeof(int32), 1, fp, byteswap, &chksum) !=
            1)
        || (bio_fread(&n, sizeof(int32), 1, fp, byteswap, &chksum) != 1)) {
        E_FATAL("bio_fread(%s) (arraysize) failed\n", file_name);
    }
    if (n_feat != s->g->n_feat)
        E_FATAL("#Features streams(%d) != %d\n", n_feat, s->g->n_feat);
    if (n != n_sen * n_feat * n_comp) {
        E_FATAL
            ("%s: #float32s(%d) doesn't match header dimensions: %d x %d x %d\n",
             file_name, i, n_sen, n_feat, n_comp);
    }

    /* n_sen = number of mixture weights per codeword, which is
     * fixed at the number of senones since we have only one codebook.
     */
    s->n_sen = n_sen;

    /* Quantized mixture weight arrays. */
    s->mixw = ckd_calloc_3d(s->g->n_feat, s->g->n_density,
                            n_sen, sizeof(***s->mixw));

    /* Temporary structure to read in floats before conversion to (int32) logs3 */
    pdf = (float32 *) ckd_calloc(n_comp, sizeof(float32));

    /* Read senone probs data, normalize, floor, convert to logs3, truncate to 8 bits */
    n_err = 0;
    for (i = 0; i < n_sen; i++) {
        for (f = 0; f < n_feat; f++) {
            if (bio_fread((void *) pdf, sizeof(float32),
                          n_comp, fp, byteswap, &chksum) != n_comp) {
                E_FATAL("bio_fread(%s) (arraydata) failed\n", file_name);
            }

            /* Normalize and floor */
            if (vector_sum_norm(pdf, n_comp) <= 0.0)
                n_err++;
            vector_floor(pdf, n_comp, SmoothMin);
            vector_sum_norm(pdf, n_comp);

            /* Convert to LOG, quantize, and transpose */
            for (c = 0; c < n_comp; c++) {
                int32 qscr;

                qscr = -logmath_log(s->lmath_8b, pdf[c]);
                if ((qscr > MAX_NEG_MIXW) || (qscr < 0))
                    qscr = MAX_NEG_MIXW;
                s->mixw[f][c][i] = qscr;
            }
        }
    }
    if (n_err > 0)
        E_WARN("Weight normalization failed for %d mixture weights components\n", n_err);

    ckd_free(pdf);

    if (chksum_present)
        bio_verify_chksum(fp, byteswap, chksum);

    if (fread(&eofchk, 1, 1, fp) == 1)
        E_FATAL("More data than expected in %s\n", file_name);

    fclose(fp);

    E_INFO("Read %d x %d x %d mixture weights\n", n_sen, n_feat, n_comp);
    return n_sen;
}